

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void stumpless_free_all(void)

{
  clear_error();
  target_free_thread();
  target_free_global();
  entry_free_all();
  strbuilder_free_all();
  network_free_all();
  thread_safety_free_all();
  return;
}

Assistant:

void
stumpless_free_all( void ) {
  // thread-local resources must be destroyed before the global resources as
  // they may be using space from caches allocated globally
  stumpless_free_thread(  );

  target_free_global(  );
  entry_free_all(  );
  strbuilder_free_all(  );
  config_network_free_all(  );
  config_thread_safety_free_all(  );
}